

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O0

int __thiscall MeCab::Dictionary::open(Dictionary *this,char *__file,int __oflag,...)

{
  uint uVar1;
  Mmap<char> *pMVar2;
  ostream *poVar3;
  undefined7 extraout_var;
  size_t sVar4;
  undefined7 extraout_var_00;
  void *ptr_00;
  void *pvVar5;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  char *pcVar6;
  Mmap<char> *pMVar7;
  undefined7 extraout_var_03;
  uint dummy;
  uint magic;
  uint fsize;
  uint tsize;
  uint dsize;
  char *ptr;
  whatlog *in_stack_ffffffffffffff78;
  wlog *in_stack_ffffffffffffff80;
  wlog local_68;
  wlog local_60;
  wlog local_58 [2];
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  Mmap<char> *local_38;
  wlog local_30;
  wlog local_28;
  undefined8 local_20;
  char *local_18;
  Dictionary *local_10;
  bool local_1;
  
  local_20 = ___oflag;
  local_18 = __file;
  local_10 = this;
  close(this,(int)__file);
  std::__cxx11::string::assign((char *)&this->filename_);
  pMVar2 = scoped_ptr<MeCab::Mmap<char>_>::operator->(&this->dmmap_);
  uVar1 = Mmap<char>::open(pMVar2,local_18,(int)local_20);
  if ((uVar1 & 1) == 0) {
    wlog::wlog(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    poVar3 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4f);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"dmmap_->open(file, mode)");
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,"no such file or directory: ");
    poVar3 = std::operator<<(poVar3,local_18);
    local_1 = wlog::operator&(&local_28,poVar3);
    pMVar2 = (Mmap<char> *)CONCAT71(extraout_var,local_1);
  }
  else {
    pMVar2 = scoped_ptr<MeCab::Mmap<char>_>::operator->(&this->dmmap_);
    sVar4 = Mmap<char>::size(pMVar2);
    if (sVar4 < 100) {
      wlog::wlog(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      poVar3 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x52);
      poVar3 = std::operator<<(poVar3,") [");
      poVar3 = std::operator<<(poVar3,"dmmap_->size() >= 100");
      poVar3 = std::operator<<(poVar3,"] ");
      poVar3 = std::operator<<(poVar3,"dictionary file is broken: ");
      poVar3 = std::operator<<(poVar3,local_18);
      local_1 = wlog::operator&(&local_30,poVar3);
      pMVar2 = (Mmap<char> *)CONCAT71(extraout_var_00,local_1);
    }
    else {
      pMVar2 = scoped_ptr<MeCab::Mmap<char>_>::operator->(&this->dmmap_);
      local_38 = (Mmap<char> *)Mmap<char>::begin(pMVar2);
      read_static<unsigned_int>
                ((char **)in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
      ptr_00 = (void *)(ulong)(local_48 ^ 0xef718f77);
      pMVar2 = scoped_ptr<MeCab::Mmap<char>_>::operator->(&this->dmmap_);
      pvVar5 = (void *)Mmap<char>::size(pMVar2);
      if (ptr_00 == pvVar5) {
        read_static<unsigned_int>
                  ((char **)in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
        if (this->version_ == 0x66) {
          read_static<unsigned_int>
                    ((char **)in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
          read_static<unsigned_int>
                    ((char **)in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
          read_static<unsigned_int>
                    ((char **)in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
          read_static<unsigned_int>
                    ((char **)in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
          read_static<unsigned_int>
                    ((char **)in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
          read_static<unsigned_int>
                    ((char **)in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
          read_static<unsigned_int>
                    ((char **)in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
          read_static<unsigned_int>
                    ((char **)in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
          this->charset_ = (char *)local_38;
          local_38 = (Mmap<char> *)((long)local_38 + 0x20);
          Darts::
          DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
          set_array((DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
                     *)this,ptr_00,(size_t)in_stack_ffffffffffffff80);
          this->token_ = (Token *)((long)local_38 + (ulong)local_3c);
          pcVar6 = (char *)((long)&((Token *)((long)local_38 + (ulong)local_3c))->lcAttr +
                           (ulong)local_40);
          this->feature_ = pcVar6;
          pMVar2 = (Mmap<char> *)(pcVar6 + local_44);
          local_38 = pMVar2;
          scoped_ptr<MeCab::Mmap<char>_>::operator->(&this->dmmap_);
          pMVar7 = (Mmap<char> *)Mmap<char>::end(pMVar2);
          if (pMVar2 == pMVar7) {
            local_1 = true;
          }
          else {
            wlog::wlog((wlog *)pMVar2,in_stack_ffffffffffffff78);
            poVar3 = std::operator<<((ostream *)&this->what_,
                                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                    );
            poVar3 = std::operator<<(poVar3,"(");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x7a);
            poVar3 = std::operator<<(poVar3,") [");
            poVar3 = std::operator<<(poVar3,"ptr == dmmap_->end()");
            poVar3 = std::operator<<(poVar3,"] ");
            poVar3 = std::operator<<(poVar3,"dictionary file is broken: ");
            poVar3 = std::operator<<(poVar3,local_18);
            local_1 = wlog::operator&(&local_68,poVar3);
            pMVar2 = (Mmap<char> *)CONCAT71(extraout_var_03,local_1);
          }
        }
        else {
          wlog::wlog(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          poVar3 = std::operator<<((ostream *)&this->what_,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,"(");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x62);
          poVar3 = std::operator<<(poVar3,") [");
          poVar3 = std::operator<<(poVar3,"version_ == DIC_VERSION");
          poVar3 = std::operator<<(poVar3,"] ");
          poVar3 = std::operator<<(poVar3,"incompatible version: ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->version_);
          local_1 = wlog::operator&(&local_60,poVar3);
          pMVar2 = (Mmap<char> *)CONCAT71(extraout_var_02,local_1);
        }
      }
      else {
        wlog::wlog(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        poVar3 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                );
        poVar3 = std::operator<<(poVar3,"(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x5e);
        poVar3 = std::operator<<(poVar3,") [");
        poVar3 = std::operator<<(poVar3,"(magic ^ DictionaryMagicID) == dmmap_->size()");
        poVar3 = std::operator<<(poVar3,"] ");
        poVar3 = std::operator<<(poVar3,"dictionary file is broken: ");
        poVar3 = std::operator<<(poVar3,local_18);
        local_1 = wlog::operator&(local_58,poVar3);
        pMVar2 = (Mmap<char> *)CONCAT71(extraout_var_01,local_1);
      }
    }
  }
  return (int)CONCAT71((int7)((ulong)pMVar2 >> 8),local_1);
}

Assistant:

bool Dictionary::open(const char *file, const char *mode) {
  close();
  filename_.assign(file);
  CHECK_FALSE(dmmap_->open(file, mode))
      << "no such file or directory: " << file;

  CHECK_FALSE(dmmap_->size() >= 100)
      << "dictionary file is broken: " << file;

  const char *ptr = dmmap_->begin();

  unsigned int dsize;
  unsigned int tsize;
  unsigned int fsize;
  unsigned int magic;
  unsigned int dummy;

  read_static<unsigned int>(&ptr, magic);
  CHECK_FALSE((magic ^ DictionaryMagicID) == dmmap_->size())
      << "dictionary file is broken: " << file;

  read_static<unsigned int>(&ptr, version_);
  CHECK_FALSE(version_ == DIC_VERSION)
      << "incompatible version: " << version_;

  read_static<unsigned int>(&ptr, type_);
  read_static<unsigned int>(&ptr, lexsize_);
  read_static<unsigned int>(&ptr, lsize_);
  read_static<unsigned int>(&ptr, rsize_);
  read_static<unsigned int>(&ptr, dsize);
  read_static<unsigned int>(&ptr, tsize);
  read_static<unsigned int>(&ptr, fsize);
  read_static<unsigned int>(&ptr, dummy);

  charset_ = ptr;
  ptr += 32;
  da_.set_array(reinterpret_cast<void *>(const_cast<char*>(ptr)));

  ptr += dsize;

  token_ = reinterpret_cast<const Token *>(ptr);
  ptr += tsize;

  feature_ = ptr;
  ptr += fsize;

  CHECK_FALSE(ptr == dmmap_->end())
      << "dictionary file is broken: " << file;

  return true;
}